

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O3

int trico_read_vec2_float(void *a,float **uv,trico_stream_type st)

{
  uint32_t *__src;
  uint *__src_00;
  uint32_t nr_of_uv_positions;
  long lVar1;
  uint32_t *puVar2;
  ulong uVar3;
  uint *puVar4;
  uint8_t *puVar5;
  uint64_t sz;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint32_t nr_of_floats_v;
  uint32_t nr_of_floats_u;
  float *decompressed_v;
  float *decompressed_u;
  uint32_t local_48;
  uint32_t local_44;
  float *local_40;
  float *local_38;
  
  iVar7 = 0;
  iVar8 = 0;
  if ((*(trico_stream_type *)((long)a + 0x24) == st) &&
     (iVar8 = iVar7, *(int *)((long)a + 0x40) == 0)) {
    lVar1 = *(long *)((long)a + 0x10);
    puVar2 = *(uint32_t **)((long)a + 0x18);
    uVar3 = *(ulong *)((long)a + 0x30);
    if ((ulong)((long)puVar2 + (4 - lVar1)) <= uVar3) {
      nr_of_uv_positions = *puVar2;
      *(uint32_t **)((long)a + 0x18) = puVar2 + 1;
      if ((ulong)((long)(puVar2 + 1) + (4 - lVar1)) <= uVar3) {
        uVar6 = (ulong)puVar2[1];
        __src = puVar2 + 2;
        *(uint32_t **)((long)a + 0x18) = __src;
        puVar5 = (uint8_t *)malloc(uVar6);
        if ((long)puVar2 + ((uVar6 + 8) - lVar1) <= uVar3) {
          memcpy(puVar5,__src,uVar6);
          *(ulong *)((long)a + 0x18) = (long)__src + uVar6;
          trico_decompress(&local_44,&local_38,puVar5);
          iVar8 = 0;
          if (*(int *)((long)a + 0x40) == 0) {
            lVar1 = *(long *)((long)a + 0x10);
            puVar4 = *(uint **)((long)a + 0x18);
            uVar3 = *(ulong *)((long)a + 0x30);
            if ((ulong)((long)puVar4 + (4 - lVar1)) <= uVar3) {
              uVar6 = (ulong)*puVar4;
              __src_00 = puVar4 + 1;
              *(uint **)((long)a + 0x18) = __src_00;
              puVar5 = (uint8_t *)realloc(puVar5,uVar6);
              if ((long)puVar4 + ((uVar6 + 4) - lVar1) <= uVar3) {
                memcpy(puVar5,__src_00,uVar6);
                *(ulong *)((long)a + 0x18) = (long)__src_00 + uVar6;
                trico_decompress(&local_48,&local_40,puVar5);
                free(puVar5);
                if (local_44 != nr_of_uv_positions) {
                  __assert_fail("nr_of_floats_u == nr_vec2_positions",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                ,0x4fe,
                                "int trico_read_vec2_float(void *, float **, enum trico_stream_type)"
                               );
                }
                if (local_48 != nr_of_uv_positions) {
                  __assert_fail("nr_of_floats_v == nr_of_floats_u",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                ,0x4ff,
                                "int trico_read_vec2_float(void *, float **, enum trico_stream_type)"
                               );
                }
                if (uv != (float **)0x0) {
                  trico_transpose_uv_soa_to_aos(uv,local_38,local_40,nr_of_uv_positions);
                }
                free(local_38);
                free(local_40);
                read_next_stream_type((trico_archive *)a);
                iVar8 = 1;
              }
            }
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

static int trico_read_vec2_float(void* a, float** uv, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != st)
    return 0;

  uint32_t nr_vec2_positions;
  if (!read(&nr_vec2_positions, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  float* decompressed_u;
  uint32_t nr_of_floats_u;
  trico_decompress(&nr_of_floats_u, &decompressed_u, (const uint8_t*)compressed);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  float* decompressed_v;
  uint32_t nr_of_floats_v;
  trico_decompress(&nr_of_floats_v, &decompressed_v, (const uint8_t*)compressed);

  trico_free(compressed);

  assert(nr_of_floats_u == nr_vec2_positions);
  assert(nr_of_floats_v == nr_of_floats_u);

  if (uv != NULL)
    trico_transpose_uv_soa_to_aos(uv, decompressed_u, decompressed_v, nr_vec2_positions);

  trico_free(decompressed_u);
  trico_free(decompressed_v);

  read_next_stream_type(arch);

  return 1;
  }